

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idle.c
# Opt level: O0

void timer_cb(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if (handle != &timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-walk-handles.c"
            ,0x2d,"handle == &timer");
    abort();
  }
  uv_walk(timer.loop,walk_cb,magic_cookie);
  uv_close(&timer,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  ASSERT(handle == &timer_handle);

  uv_close((uv_handle_t*) &idle_handle, close_cb);
  uv_close((uv_handle_t*) &check_handle, close_cb);
  uv_close((uv_handle_t*) &timer_handle, close_cb);

  timer_cb_called++;
  fprintf(stderr, "timer_cb %d\n", timer_cb_called);
  fflush(stderr);
}